

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<void> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::writeWithFds
          (BlockedPumpTo *this,ArrayPtr<const_unsigned_char> data,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> moreData,ArrayPtr<const_int> fds)

{
  ArrayPtr<const_unsigned_char> *__buf;
  long in_R9;
  Array<const_kj::ArrayPtr<const_unsigned_char>_> local_70;
  ArrayBuilder<const_kj::ArrayPtr<const_unsigned_char>_> local_58;
  
  if (in_R9 == 0) {
    write(this,(int)data.ptr,(uchar *)data.size_,(size_t)moreData.ptr);
  }
  else {
    __buf = kj::_::HeapArrayDisposer::allocateUninitialized<kj::ArrayPtr<unsigned_char_const>>
                      (in_R9 + 1);
    local_58.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    __buf->ptr = (uchar *)data.size_;
    __buf->size_ = (size_t)moreData.ptr;
    memcpy(__buf + 1,(void *)moreData.size_,in_R9 * 0x10);
    local_70.size_ = (long)(in_R9 * 0x10 + 0x10U) >> 4;
    local_70.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    local_58.ptr = (ArrayPtr<const_unsigned_char> *)0x0;
    local_58.pos = (RemoveConst<const_kj::ArrayPtr<const_unsigned_char>_> *)0x0;
    local_58.endPtr = (ArrayPtr<const_unsigned_char> *)0x0;
    local_70.ptr = __buf;
    write(this,(int)data.ptr,__buf,local_70.size_);
    Array<const_kj::ArrayPtr<const_unsigned_char>_>::~Array(&local_70);
    ArrayBuilder<const_kj::ArrayPtr<const_unsigned_char>_>::dispose(&local_58);
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeWithFds(ArrayPtr<const byte> data,
                               ArrayPtr<const ArrayPtr<const byte>> moreData,
                               ArrayPtr<const int> fds) override {
      // Pumps drop all capabilities, so fall back to regular write().

      // TODO(cleaunp): After stream API refactor, regular write() methods will take
      //   (data, moreData) and we can clean this up.
      if (moreData.size() == 0) {
        return write(data);
      } else {
        auto pieces = kj::heapArrayBuilder<const ArrayPtr<const byte>>(moreData.size() + 1);
        pieces.add(data);
        pieces.addAll(moreData);
        return write(pieces.finish());
      }
    }